

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH_errorcode ZSTD_XXH64_update(XXH64_state_t *state,void *input,size_t len)

{
  ulong uVar1;
  XXH64_hash_t XVar2;
  long *plVar3;
  XXH64_hash_t XVar4;
  XXH64_hash_t XVar5;
  XXH64_hash_t XVar6;
  
  if (input != (void *)0x0) {
    state->total_len = state->total_len + len;
    uVar1 = (ulong)state->memsize;
    if (uVar1 + len < 0x20) {
      memcpy((void *)((long)state->mem64 + uVar1),input,len);
      uVar1 = (ulong)((int)len + state->memsize);
    }
    else {
      plVar3 = (long *)(len + (long)input);
      if (uVar1 != 0) {
        memcpy((void *)((long)state->mem64 + uVar1),input,(ulong)(0x20 - state->memsize));
        uVar1 = state->mem64[0] * -0x3d4d51c2d82b14b1 + state->v[0];
        state->v[0] = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        uVar1 = state->mem64[1] * -0x3d4d51c2d82b14b1 + state->v[1];
        state->v[1] = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        uVar1 = state->mem64[2] * -0x3d4d51c2d82b14b1 + state->v[2];
        state->v[2] = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        uVar1 = state->mem64[3] * -0x3d4d51c2d82b14b1 + state->v[3];
        state->v[3] = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        input = (void *)((long)input + (ulong)(0x20 - state->memsize));
        state->memsize = 0;
      }
      if ((long *)((long)input + 0x20) <= plVar3) {
        XVar2 = state->v[0];
        XVar5 = state->v[1];
        XVar6 = state->v[2];
        XVar4 = state->v[3];
        do {
          uVar1 = *input * -0x3d4d51c2d82b14b1 + XVar2;
          XVar2 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
          state->v[0] = XVar2;
          uVar1 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + XVar5;
          XVar5 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
          state->v[1] = XVar5;
          uVar1 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + XVar6;
          XVar6 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
          state->v[2] = XVar6;
          uVar1 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + XVar4;
          XVar4 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
          state->v[3] = XVar4;
          input = (void *)((long)input + 0x20);
        } while (input <= plVar3 + -4);
      }
      if (plVar3 <= input) {
        return XXH_OK;
      }
      uVar1 = (long)plVar3 - (long)input;
      memcpy(state->mem64,input,uVar1);
    }
    state->memsize = (XXH32_hash_t)uVar1;
  }
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH64_update (XXH64_state_t* state, const void* input, size_t len)
{
    if (input==NULL) {
        XXH_ASSERT(len == 0);
        return XXH_OK;
    }

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len += len;

        if (state->memsize + len < 32) {  /* fill in tmp buffer */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, len);
            state->memsize += (xxh_u32)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* tmp buffer is full */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, 32-state->memsize);
            state->v[0] = XXH64_round(state->v[0], XXH_readLE64(state->mem64+0));
            state->v[1] = XXH64_round(state->v[1], XXH_readLE64(state->mem64+1));
            state->v[2] = XXH64_round(state->v[2], XXH_readLE64(state->mem64+2));
            state->v[3] = XXH64_round(state->v[3], XXH_readLE64(state->mem64+3));
            p += 32 - state->memsize;
            state->memsize = 0;
        }

        if (p+32 <= bEnd) {
            const xxh_u8* const limit = bEnd - 32;

            do {
                state->v[0] = XXH64_round(state->v[0], XXH_readLE64(p)); p+=8;
                state->v[1] = XXH64_round(state->v[1], XXH_readLE64(p)); p+=8;
                state->v[2] = XXH64_round(state->v[2], XXH_readLE64(p)); p+=8;
                state->v[3] = XXH64_round(state->v[3], XXH_readLE64(p)); p+=8;
            } while (p<=limit);

        }

        if (p < bEnd) {
            XXH_memcpy(state->mem64, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}